

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Validator::validateCompactObject(Validator *this,uint8_t *ptr,size_t length)

{
  bool bVar1;
  undefined8 uVar2;
  Exception *this_00;
  int64_t iVar3;
  char *msg;
  ValueLength VVar4;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  bool in_stack_0000000f;
  size_t in_stack_00000010;
  uint8_t *in_stack_00000018;
  Validator *in_stack_00000020;
  ValueLength keySize;
  bool isSmallInt;
  bool isString;
  Slice key;
  uint8_t *e;
  ValueLength nrItems;
  uint8_t *data;
  ValueLength byteSize;
  uint8_t *p;
  bool in_stack_ffffffffffffff6f;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffff70;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffff78;
  Exception *in_stack_ffffffffffffff80;
  uint8_t *in_stack_ffffffffffffff88;
  uint8_t **in_stack_ffffffffffffff90;
  Slice local_60;
  ValueLength local_58;
  byte local_4a;
  byte local_49;
  Slice local_48;
  uint8_t *local_40;
  ValueLength local_38;
  uint8_t *local_30;
  ValueLength local_28;
  uint8_t *local_20;
  ulong local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  validateBufferLength
            ((Validator *)in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
             (size_t)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  local_20 = (uint8_t *)(local_10 + 1);
  local_28 = ReadVariableLengthValue<false>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if ((local_18 < local_28) || (local_28 < 5)) {
    uVar2 = __cxa_allocate_exception(0x18);
    Exception::Exception
              (in_stack_ffffffffffffff80,(ExceptionType)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               (char *)in_stack_ffffffffffffff70);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  local_30 = local_20;
  local_20 = (uint8_t *)(local_10 + local_28 + -1);
  local_38 = ReadVariableLengthValue<true>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (local_38 == 0) {
    uVar2 = __cxa_allocate_exception(0x18);
    Exception::Exception
              (in_stack_ffffffffffffff80,(ExceptionType)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               (char *)in_stack_ffffffffffffff70);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  local_40 = (uint8_t *)((long)local_20 + 1);
  local_20 = local_30;
  while( true ) {
    VVar4 = local_38 - 1;
    if (local_38 == 0) {
      if (local_20 == local_40) {
        return;
      }
      local_38 = VVar4;
      msg = (char *)__cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_ffffffffffffff80,(ExceptionType)((ulong)in_stack_ffffffffffffff78 >> 0x20)
                 ,msg);
      __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
    }
    if (local_40 <= local_20) break;
    local_38 = VVar4;
    validatePart(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000f);
    Slice::Slice(&local_48,local_20);
    local_49 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isString
                         ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                          0x11670f);
    if ((!(bool)local_49) &&
       (((local_4a = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isSmallInt
                               ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                 *)0x116726), !(bool)local_4a &&
         (bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isUInt
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             0x11673d), !bVar1)) ||
        (((local_4a & 1) != 0 &&
         (iVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getSmallInt
                            (in_stack_ffffffffffffff78), iVar3 < 1)))))) {
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_ffffffffffffff80,(ExceptionType)((ulong)uVar2 >> 0x20),
                 (char *)in_stack_ffffffffffffff70);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    local_58 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                         (in_stack_ffffffffffffff70);
    if (((local_49 & 1) != 0) && ((*(byte *)(*in_RDI + 0x1e) & 1) != 0)) {
      validatePart(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000f);
    }
    local_20 = local_20 + local_58;
    validatePart(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000f);
    Slice::Slice(&local_60,local_20);
    VVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      (in_stack_ffffffffffffff70);
    local_20 = local_20 + VVar4;
  }
  local_38 = VVar4;
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception
            (this_00,(ExceptionType)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (char *)in_stack_ffffffffffffff70);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateCompactObject(uint8_t const* ptr, std::size_t length) {
  // compact Object without index table
  validateBufferLength(5, length, true);

  uint8_t const* p = ptr + 1;
  // read byteLength
  ValueLength const byteSize = ReadVariableLengthValue<false>(p, p + length);
  if (byteSize > length || byteSize < 5) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object length value is out of bounds");
  }

  // read nrItems
  uint8_t const* data = p;
  p = ptr + byteSize - 1;
  ValueLength nrItems = ReadVariableLengthValue<true>(p, ptr + byteSize);
  if (nrItems == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object length value is out of bounds");
  }
  ++p;

  // validate the object members
  uint8_t const* e = p;
  p = data;
  while (nrItems-- > 0) {
    if (p >= e) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object items number is out of bounds");
    }
    // validate key
    validatePart(p, e - p, true);
    Slice key(p);
    bool isString = key.isString();
    if (!isString) {
      bool const isSmallInt = key.isSmallInt();
      if ((!isSmallInt && !key.isUInt()) ||
          (isSmallInt && key.getSmallInt() <= 0)) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Invalid object key type");
      }
    }
    ValueLength keySize = key.byteSize();
    // validate key
    if (isString && options->validateUtf8Strings) {
      validatePart(p, keySize, true);
    }

    // validate value
    p += keySize;
    validatePart(p, e - p, true);
    p += Slice(p).byteSize();
  }

  // finally check if we are now pointing at the end or not
  if (p != e) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object has more members than specified");
  }
}